

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::RegisterInstantiation
          (TypeParameterizedTestSuiteRegistry *this,char *test_suite_name)

{
  iterator iVar1;
  size_t sVar2;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,test_suite_name,&local_39);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
                  *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar1._M_node == &(this->suites_)._M_t._M_impl.super__Rb_tree_header) {
    GTestLog::GTestLog((GTestLog *)&local_38,GTEST_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/testing/googletest/googletest/src/gtest.cc"
                       ,0x22e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unknown type parameterized test suit \'",0x26);
    if (test_suite_name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x152590);
    }
    else {
      sVar2 = strlen(test_suite_name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,test_suite_name,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
    GTestLog::~GTestLog((GTestLog *)&local_38);
  }
  else {
    *(undefined1 *)&iVar1._M_node[3]._M_parent = 1;
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::RegisterInstantiation(
        const char* test_suite_name) {
  auto it = suites_.find(std::string(test_suite_name));
  if (it != suites_.end()) {
    it->second.instantiated = true;
  } else {
    GTEST_LOG_(ERROR) << "Unknown type parameterized test suit '"
                      << test_suite_name << "'";
  }
}